

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::TraverseSchema::checkElemDeclValueConstraint
          (TraverseSchema *this,DOMElement *elem,SchemaElementDecl *elemDecl,XMLCh *valConstraint,
          ComplexTypeInfo *typeInfo,DatatypeValidator *validator)

{
  XMLStringPool *pXVar1;
  bool bVar2;
  short sVar3;
  ValidatorType VVar4;
  uint uVar5;
  int iVar6;
  XMLCh *pXVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ContentSpecNode *specNode;
  int contentSpecType;
  XMLException *excep;
  OutOfMemoryException *anon_var_0;
  ArrayJanitor<char16_t> tempCanonical;
  XMLCh *canonical;
  ArrayJanitor<char16_t> tempURIName;
  XMLCh *normalizedValue;
  XMLCh *pXStack_48;
  short wsFacet;
  XMLCh *valueToCheck;
  bool isValid;
  DatatypeValidator *validator_local;
  ComplexTypeInfo *typeInfo_local;
  XMLCh *valConstraint_local;
  SchemaElementDecl *elemDecl_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  valueToCheck._7_1_ = false;
  if (validator != (DatatypeValidator *)0x0) {
    VVar4 = DatatypeValidator::getType(validator);
    if (VVar4 == ID) {
      pXVar7 = XMLElementDecl::getBaseName(&elemDecl->super_XMLElementDecl);
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x5c,pXVar7,valConstraint,
                        (XMLCh *)0x0,(XMLCh *)0x0);
    }
    sVar3 = DatatypeValidator::getWSFacet(validator);
    if (((sVar3 == 1) && (bVar2 = XMLString::isWSReplaced(valConstraint), !bVar2)) ||
       ((pXStack_48 = valConstraint, sVar3 == 2 &&
        (bVar2 = XMLString::isWSCollapsed(valConstraint), !bVar2)))) {
      tempURIName.fMemoryManager =
           (MemoryManager *)XMLString::replicate(valConstraint,this->fMemoryManager);
      ArrayJanitor<char16_t>::ArrayJanitor
                ((ArrayJanitor<char16_t> *)&canonical,(char16_t *)tempURIName.fMemoryManager,
                 this->fMemoryManager);
      if (sVar3 == 1) {
        XMLString::replaceWS((XMLCh *)tempURIName.fMemoryManager,this->fMemoryManager);
      }
      else if (sVar3 == 2) {
        XMLString::collapseWS((XMLCh *)tempURIName.fMemoryManager,this->fMemoryManager);
      }
      pXVar1 = this->fStringPool;
      uVar5 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])
                        (pXVar1,tempURIName.fMemoryManager);
      iVar6 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[10])(pXVar1,(ulong)uVar5);
      pXStack_48 = (XMLCh *)CONCAT44(extraout_var,iVar6);
      ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&canonical);
    }
    (*(validator->super_XSerializable)._vptr_XSerializable[8])
              (validator,pXStack_48,0,this->fMemoryManager);
    iVar6 = (*(validator->super_XSerializable)._vptr_XSerializable[7])
                      (validator,pXStack_48,this->fMemoryManager,0);
    tempCanonical.fMemoryManager = (MemoryManager *)CONCAT44(extraout_var_00,iVar6);
    ArrayJanitor<char16_t>::ArrayJanitor
              ((ArrayJanitor<char16_t> *)&anon_var_0,(char16_t *)tempCanonical.fMemoryManager,
               this->fMemoryManager);
    bVar2 = XMLString::equals((XMLCh *)tempCanonical.fMemoryManager,pXStack_48);
    if (!bVar2) {
      (*(validator->super_XSerializable)._vptr_XSerializable[8])
                (validator,tempCanonical.fMemoryManager,0,this->fMemoryManager);
      pXVar1 = this->fStringPool;
      uVar5 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])
                        (pXVar1,tempCanonical.fMemoryManager);
      iVar6 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[10])(pXVar1,(ulong)uVar5);
      pXStack_48 = (XMLCh *)CONCAT44(extraout_var_01,iVar6);
    }
    SchemaElementDecl::setDefaultValue(elemDecl,pXStack_48);
    valueToCheck._7_1_ = true;
    ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&anon_var_0);
  }
  if (typeInfo != (ComplexTypeInfo *)0x0) {
    iVar6 = ComplexTypeInfo::getContentType(typeInfo);
    if (((iVar6 != 5) && (iVar6 != 2)) && (iVar6 != 3)) {
      pXVar7 = XMLElementDecl::getBaseName(&elemDecl->super_XMLElementDecl);
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x37,pXVar7,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
    }
    if ((iVar6 == 3) || (iVar6 == 2)) {
      specNode = ComplexTypeInfo::getContentSpec(typeInfo);
      bVar2 = emptiableParticle(this,specNode);
      if (!bVar2) {
        pXVar7 = XMLElementDecl::getBaseName(&elemDecl->super_XMLElementDecl);
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x5e,pXVar7,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
  }
  return valueToCheck._7_1_;
}

Assistant:

bool
TraverseSchema::checkElemDeclValueConstraint(const DOMElement* const elem,
                                             SchemaElementDecl* const elemDecl,
                                             const XMLCh* const valConstraint,
                                             ComplexTypeInfo* const typeInfo,
                                             DatatypeValidator* const validator)
{
    bool isValid = false;
    if (validator)
    {
        if (validator->getType() == DatatypeValidator::ID)
            reportSchemaError(
                elem, XMLUni::fgXMLErrDomain, XMLErrs::ElemIDValueConstraint
                , elemDecl->getBaseName(), valConstraint
            );

        try
        {
            const XMLCh* valueToCheck = valConstraint;
            short wsFacet = validator->getWSFacet();
            if((wsFacet == DatatypeValidator::REPLACE && !XMLString::isWSReplaced(valueToCheck)) ||
               (wsFacet == DatatypeValidator::COLLAPSE && !XMLString::isWSCollapsed(valueToCheck)))
            {
                XMLCh* normalizedValue=XMLString::replicate(valueToCheck, fMemoryManager);
                ArrayJanitor<XMLCh> tempURIName(normalizedValue, fMemoryManager);
                if(wsFacet == DatatypeValidator::REPLACE)
                    XMLString::replaceWS(normalizedValue, fMemoryManager);
                else if(wsFacet == DatatypeValidator::COLLAPSE)
                    XMLString::collapseWS(normalizedValue, fMemoryManager);
                valueToCheck=fStringPool->getValueForId(fStringPool->addOrFind(normalizedValue));
            }

            validator->validate(valueToCheck,0,fMemoryManager);

            XMLCh* canonical = (XMLCh*) validator->getCanonicalRepresentation(valueToCheck, fMemoryManager);
            ArrayJanitor<XMLCh> tempCanonical(canonical, fMemoryManager);

            if(!XMLString::equals(canonical, valueToCheck))
            {
                validator->validate(canonical, 0, fMemoryManager);
                valueToCheck=fStringPool->getValueForId(fStringPool->addOrFind(canonical));
            }

            elemDecl->setDefaultValue(valueToCheck);

            isValid = true;
        }
        catch(const XMLException& excep)
        {
            reportSchemaError(elem, excep);
        }
        catch(const OutOfMemoryException&)
        {
            throw;
        }
        catch(...)
        {
            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::DatatypeValidationFailure, valConstraint);
        }
    }

    if (typeInfo)
    {
        int contentSpecType = typeInfo->getContentType();

        if (contentSpecType != SchemaElementDecl::Simple &&
            contentSpecType != SchemaElementDecl::Mixed_Simple &&
            contentSpecType != SchemaElementDecl::Mixed_Complex)
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NotSimpleOrMixedElement, elemDecl->getBaseName());

        if (((contentSpecType == SchemaElementDecl::Mixed_Complex
             || contentSpecType == SchemaElementDecl::Mixed_Simple)
            && !emptiableParticle(typeInfo->getContentSpec())))
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::EmptiableMixedContent, elemDecl->getBaseName());
    }

    return isValid;
}